

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeDriverRTASFormatCompatibilityCheckExtPrologue
          (ZEParameterValidation *this,ze_driver_handle_t hDriver,ze_rtas_format_ext_t rtasFormatA,
          ze_rtas_format_ext_t rtasFormatB)

{
  ze_rtas_format_ext_t rtasFormatB_local;
  ze_rtas_format_ext_t rtasFormatA_local;
  ze_driver_handle_t hDriver_local;
  ZEParameterValidation *this_local;
  
  if (hDriver == (ze_driver_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if ((int)rtasFormatA < 0x7fffffff) {
    if ((int)rtasFormatB < 0x7fffffff) {
      this_local._4_4_ = ZE_RESULT_SUCCESS;
    }
    else {
      this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
    }
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeDriverRTASFormatCompatibilityCheckExtPrologue(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        ze_rtas_format_ext_t rtasFormatA,               ///< [in] operand A
        ze_rtas_format_ext_t rtasFormatB                ///< [in] operand B
        )
    {
        if( nullptr == hDriver )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( ZE_RTAS_FORMAT_EXT_MAX < rtasFormatA )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( ZE_RTAS_FORMAT_EXT_MAX < rtasFormatB )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ZE_RESULT_SUCCESS;
    }